

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
write_significand<char,fmt::v11::basic_appender<char>,char_const*,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,char *significand,int significand_size,int exponent,
          digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  basic_appender<char> bVar1;
  memory_buffer buffer;
  char local_239;
  buffer<char> local_238;
  undefined1 local_218 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    buffer<char>::append<char>(out.container,significand,significand + significand_size);
    local_238.ptr_._0_1_ = 0x30;
    bVar1 = fill_n<fmt::v11::basic_appender<char>,int,char>(out,exponent,&local_238);
  }
  else {
    local_238.size_ = 0;
    local_238.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
    local_238.ptr_._0_1_ = SUB81(local_218,0);
    local_238.ptr_._1_7_ = (undefined7)((ulong)local_218 >> 8);
    local_238.capacity_ = 500;
    buffer<char>::append<char>(&local_238,significand,significand + significand_size);
    local_239 = '0';
    fill_n<fmt::v11::basic_appender<char>,int,char>(&local_238,exponent,&local_239);
    digits.data_._1_7_ = local_238.ptr_._1_7_;
    digits.data_._0_1_ = local_238.ptr_._0_1_;
    digits.size_ = local_238.size_;
    bVar1 = digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>(grouping,out,digits);
    if ((undefined1 *)CONCAT71(local_238.ptr_._1_7_,local_238.ptr_._0_1_) != local_218) {
      free((undefined1 *)CONCAT71(local_238.ptr_._1_7_,local_238.ptr_._0_1_));
    }
  }
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}